

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void idct32x32_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar25;
  int iVar27;
  uint uVar30;
  uint uVar31;
  undefined1 auVar19 [16];
  int iVar32;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint uVar26;
  uint uVar28;
  uint uVar29;
  uint uVar33;
  uint uVar34;
  undefined1 auVar24 [16];
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar45;
  int iVar46;
  uint uVar47;
  uint uVar48;
  int iVar52;
  int iVar58;
  undefined1 auVar49 [16];
  int iVar64;
  undefined1 auVar50 [16];
  int iVar53;
  int iVar54;
  int iVar55;
  uint uVar56;
  uint uVar57;
  int iVar59;
  int iVar60;
  int iVar61;
  uint uVar62;
  uint uVar63;
  int iVar65;
  int iVar66;
  int iVar67;
  uint uVar68;
  uint uVar69;
  undefined1 auVar51 [16];
  int iVar70;
  int iVar83;
  int iVar89;
  undefined1 auVar76 [16];
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar84;
  uint uVar85;
  uint uVar86;
  uint uVar87;
  uint uVar88;
  uint uVar90;
  uint uVar91;
  uint uVar92;
  uint uVar93;
  uint uVar94;
  uint uVar95;
  int iVar96;
  uint uVar97;
  uint uVar98;
  uint uVar99;
  uint uVar100;
  uint uVar101;
  uint uVar102;
  uint uVar103;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar104;
  int iVar106;
  int iVar107;
  undefined1 auVar105 [16];
  int iVar108;
  int iVar109;
  uint uVar110;
  uint uVar111;
  uint uVar112;
  uint uVar113;
  int iVar117;
  uint uVar118;
  uint uVar119;
  uint uVar120;
  uint uVar121;
  int iVar122;
  uint uVar123;
  uint uVar124;
  uint uVar125;
  uint uVar126;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  int iVar127;
  uint uVar128;
  uint uVar129;
  uint uVar130;
  uint uVar131;
  uint uVar132;
  uint uVar133;
  int iVar134;
  uint uVar137;
  int iVar143;
  uint uVar147;
  int iVar148;
  uint uVar152;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  uint uVar135;
  uint uVar136;
  int iVar144;
  uint uVar145;
  uint uVar146;
  int iVar149;
  uint uVar150;
  uint uVar151;
  int iVar153;
  int iVar154;
  uint uVar155;
  uint uVar156;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  uint uVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  int iVar163;
  int iVar164;
  int iVar167;
  int iVar168;
  int iVar169;
  int iVar170;
  undefined1 auVar165 [16];
  int iVar171;
  undefined1 auVar166 [16];
  int iVar172;
  int iVar173;
  uint uVar174;
  int iVar179;
  uint uVar180;
  int iVar181;
  uint uVar182;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  int iVar183;
  uint uVar184;
  int iVar185;
  int iVar193;
  int iVar195;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  int iVar197;
  undefined1 auVar189 [16];
  int iVar186;
  int iVar194;
  int iVar196;
  int iVar198;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  int iVar199;
  int iVar200;
  int iVar206;
  int iVar208;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  int iVar210;
  undefined1 auVar204 [16];
  int iVar207;
  int iVar209;
  int iVar211;
  undefined1 auVar205 [16];
  int iVar212;
  int iVar215;
  int iVar216;
  int iVar217;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  int iVar218;
  uint uVar220;
  uint uVar221;
  int iVar225;
  uint uVar227;
  int iVar228;
  uint uVar230;
  undefined1 auVar222 [16];
  int iVar219;
  int iVar226;
  int iVar229;
  int iVar231;
  int iVar232;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  uint uVar233;
  int iVar234;
  uint uVar237;
  int iVar242;
  uint uVar245;
  int iVar246;
  uint uVar249;
  undefined1 auVar238 [16];
  int iVar235;
  int iVar243;
  int iVar247;
  int iVar250;
  int iVar251;
  undefined1 auVar239 [16];
  int iVar236;
  int iVar244;
  int iVar248;
  int iVar252;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  uint uVar253;
  __m128i clamp_hi;
  __m128i clamp_lo;
  __m128i bf1 [32];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  uint local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  uint local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  uint local_1f8;
  uint uStack_1f4;
  uint uStack_1f0;
  uint uStack_1ec;
  uint local_1e8;
  uint uStack_1e4;
  uint uStack_1e0;
  uint uStack_1dc;
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint local_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  undefined1 local_168 [16];
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  auVar105 = ZEXT416((uint)bit);
  lVar9 = (long)bit * 0x100;
  iVar18 = -*(int *)((long)vert_filter_length_chroma + lVar9 + 0x248);
  iVar199 = -*(int *)((long)vert_filter_length_chroma + lVar9 + 0x228);
  iVar163 = -*(int *)((long)vert_filter_length_chroma + lVar9 + 0x230);
  iVar46 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x240);
  iVar55 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x1c0);
  iVar61 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x200);
  iVar212 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x180);
  iVar17 = -iVar61;
  iVar15 = -iVar212;
  iVar14 = -iVar46;
  iVar16 = -iVar55;
  iVar67 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x1e0);
  iVar12 = 1 << ((char)bit - 1U & 0x1f);
  iVar10 = -iVar67;
  iVar45 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x220);
  iVar8 = -iVar45;
  iVar134 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x1a0);
  iVar11 = -iVar134;
  iVar13 = bd + 6 + (uint)(do_cols == 0) * 2;
  local_258 = 0x8000;
  if (0xf < iVar13) {
    local_258 = 1 << ((char)iVar13 - 1U & 0x1f);
  }
  local_248 = -local_258;
  local_258 = local_258 + -1;
  uStack_22c = (uint)((ulong)(*in)[1] >> 0x20);
  uStack_1ec = (uint)((ulong)in[4][1] >> 0x20);
  uStack_1ac = (uint)((ulong)in[2][1] >> 0x20);
  uStack_16c = (uint)((ulong)in[6][1] >> 0x20);
  iStack_ac = (int)((ulong)in[3][1] >> 0x20);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 600);
  auVar201._4_4_ = uVar1;
  auVar201._0_4_ = uVar1;
  auVar201._8_4_ = uVar1;
  auVar201._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x198);
  auVar138._4_4_ = uVar1;
  auVar138._0_4_ = uVar1;
  auVar138._8_4_ = uVar1;
  auVar138._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x238);
  auVar187._4_4_ = uVar1;
  auVar187._0_4_ = uVar1;
  auVar187._8_4_ = uVar1;
  auVar187._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x188);
  auVar114._4_4_ = uVar1;
  auVar114._0_4_ = uVar1;
  auVar114._8_4_ = uVar1;
  auVar114._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x168);
  auVar175._4_4_ = uVar1;
  auVar175._0_4_ = uVar1;
  auVar175._8_4_ = uVar1;
  auVar175._12_4_ = uVar1;
  auVar160._4_4_ = iVar199;
  auVar160._0_4_ = iVar199;
  auVar160._8_4_ = iVar199;
  auVar160._12_4_ = iVar199;
  auVar176 = pmulld(auVar175,(undefined1  [16])in[1]);
  auVar177._0_4_ = auVar176._0_4_ + iVar12 >> auVar105;
  auVar177._4_4_ = auVar176._4_4_ + iVar12 >> auVar105;
  auVar177._8_4_ = auVar176._8_4_ + iVar12 >> auVar105;
  auVar177._12_4_ = auVar176._12_4_ + iVar12 >> auVar105;
  auVar176 = pmulld(auVar201,(undefined1  [16])in[1]);
  auVar202._0_4_ = auVar176._0_4_ + iVar12 >> auVar105;
  auVar202._4_4_ = auVar176._4_4_ + iVar12 >> auVar105;
  auVar202._8_4_ = auVar176._8_4_ + iVar12 >> auVar105;
  auVar202._12_4_ = auVar176._12_4_ + iVar12 >> auVar105;
  auVar176 = pmulld(auVar160,(undefined1  [16])in[7]);
  auVar161._0_4_ = auVar176._0_4_ + iVar12 >> auVar105;
  auVar161._4_4_ = auVar176._4_4_ + iVar12 >> auVar105;
  auVar161._8_4_ = auVar176._8_4_ + iVar12 >> auVar105;
  auVar161._12_4_ = auVar176._12_4_ + iVar12 >> auVar105;
  auVar176 = pmulld(auVar138,(undefined1  [16])in[7]);
  auVar139._0_4_ = auVar176._0_4_ + iVar12 >> auVar105;
  auVar139._4_4_ = auVar176._4_4_ + iVar12 >> auVar105;
  auVar139._8_4_ = auVar176._8_4_ + iVar12 >> auVar105;
  auVar139._12_4_ = auVar176._12_4_ + iVar12 >> auVar105;
  auVar176 = pmulld(auVar114,(undefined1  [16])in[5]);
  auVar188 = pmulld(auVar187,(undefined1  [16])in[5]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x178);
  auVar203._4_4_ = uVar1;
  auVar203._0_4_ = uVar1;
  auVar203._8_4_ = uVar1;
  auVar203._12_4_ = uVar1;
  auVar238._4_4_ = iVar18;
  auVar238._0_4_ = iVar18;
  auVar238._8_4_ = iVar18;
  auVar238._12_4_ = iVar18;
  auVar115._0_4_ = auVar176._0_4_ + iVar12 >> auVar105;
  auVar115._4_4_ = auVar176._4_4_ + iVar12 >> auVar105;
  auVar115._8_4_ = auVar176._8_4_ + iVar12 >> auVar105;
  auVar115._12_4_ = auVar176._12_4_ + iVar12 >> auVar105;
  iVar185 = auVar188._0_4_ + iVar12 >> auVar105;
  iVar193 = auVar188._4_4_ + iVar12 >> auVar105;
  iVar195 = auVar188._8_4_ + iVar12 >> auVar105;
  iVar197 = auVar188._12_4_ + iVar12 >> auVar105;
  auVar6._12_4_ = iStack_ac;
  auVar6._0_12_ = *(undefined1 (*) [12])in[3];
  auVar188 = pmulld(auVar238,auVar6);
  auVar176 = pmulld(auVar203,auVar6);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x250);
  auVar165._4_4_ = uVar1;
  auVar165._0_4_ = uVar1;
  auVar165._8_4_ = uVar1;
  auVar165._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 0x170);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  iVar234 = auVar188._0_4_ + iVar12 >> auVar105;
  iVar242 = auVar188._4_4_ + iVar12 >> auVar105;
  iVar246 = auVar188._8_4_ + iVar12 >> auVar105;
  iVar250 = auVar188._12_4_ + iVar12 >> auVar105;
  iVar199 = auVar176._0_4_ + iVar12 >> auVar105;
  iVar206 = auVar176._4_4_ + iVar12 >> auVar105;
  iVar208 = auVar176._8_4_ + iVar12 >> auVar105;
  iVar210 = auVar176._12_4_ + iVar12 >> auVar105;
  auVar192._12_4_ = uStack_1ac;
  auVar192._0_12_ = *(undefined1 (*) [12])in[2];
  auVar176 = pmulld(auVar49,auVar192);
  auVar188 = pmulld(auVar165,auVar192);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar9 + 400);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  iVar13 = auVar176._0_4_ + iVar12 >> auVar105;
  iVar52 = auVar176._4_4_ + iVar12 >> auVar105;
  iVar58 = auVar176._8_4_ + iVar12 >> auVar105;
  iVar64 = auVar176._12_4_ + iVar12 >> auVar105;
  auVar19._4_4_ = iVar163;
  auVar19._0_4_ = iVar163;
  auVar19._8_4_ = iVar163;
  auVar19._12_4_ = iVar163;
  iVar163 = auVar188._0_4_ + iVar12 >> auVar105;
  iVar167 = auVar188._4_4_ + iVar12 >> auVar105;
  iVar169 = auVar188._8_4_ + iVar12 >> auVar105;
  iVar171 = auVar188._12_4_ + iVar12 >> auVar105;
  auVar2._12_4_ = uStack_16c;
  auVar2._0_12_ = *(undefined1 (*) [12])in[6];
  auVar176 = pmulld(auVar19,auVar2);
  auVar188 = pmulld(auVar39,auVar2);
  iVar18 = auVar176._0_4_ + iVar12 >> auVar105;
  iVar25 = auVar176._4_4_ + iVar12 >> auVar105;
  iVar27 = auVar176._8_4_ + iVar12 >> auVar105;
  iVar32 = auVar176._12_4_ + iVar12 >> auVar105;
  local_168._0_4_ = auVar188._0_4_ + iVar12 >> auVar105;
  local_168._4_4_ = auVar188._4_4_ + iVar12 >> auVar105;
  local_168._8_4_ = auVar188._8_4_ + iVar12 >> auVar105;
  local_168._12_4_ = auVar188._12_4_ + iVar12 >> auVar105;
  auVar204._4_4_ = iVar212;
  auVar204._0_4_ = iVar212;
  auVar204._8_4_ = iVar212;
  auVar204._12_4_ = iVar212;
  auVar79._12_4_ = uStack_1ec;
  auVar79._0_12_ = *(undefined1 (*) [12])in[4];
  auVar176 = pmulld(auVar79,auVar204);
  iVar212 = auVar176._0_4_ + iVar12 >> auVar105;
  iVar215 = auVar176._4_4_ + iVar12 >> auVar105;
  iVar216 = auVar176._8_4_ + iVar12 >> auVar105;
  iVar217 = auVar176._12_4_ + iVar12 >> auVar105;
  auVar189._4_4_ = iVar46;
  auVar189._0_4_ = iVar46;
  auVar189._8_4_ = iVar46;
  auVar189._12_4_ = iVar46;
  auVar176 = pmulld(auVar79,auVar189);
  iVar235 = auVar176._0_4_ + iVar12 >> auVar105;
  iVar243 = auVar176._4_4_ + iVar12 >> auVar105;
  iVar247 = auVar176._8_4_ + iVar12 >> auVar105;
  iVar251 = auVar176._12_4_ + iVar12 >> auVar105;
  auVar20._4_4_ = iVar15;
  auVar20._0_4_ = iVar15;
  auVar20._8_4_ = iVar15;
  auVar20._12_4_ = iVar15;
  auVar76 = pmulld(auVar202,auVar20);
  auVar176 = pmulld(auVar177,auVar189);
  auVar178 = pmulld(auVar177,auVar204);
  auVar222 = pmulld(auVar202,auVar189);
  auVar40._4_4_ = iVar14;
  auVar40._0_4_ = iVar14;
  auVar40._8_4_ = iVar14;
  auVar40._12_4_ = iVar14;
  auVar188 = pmulld(auVar40,auVar161);
  auVar166 = pmulld(auVar139,auVar20);
  auVar162 = pmulld(auVar161,auVar20);
  auVar140._4_4_ = iVar55;
  auVar140._0_4_ = iVar55;
  auVar140._8_4_ = iVar55;
  auVar140._12_4_ = iVar55;
  auVar50 = pmulld(auVar139,auVar189);
  iVar70 = auVar76._0_4_ + iVar12 + auVar176._0_4_ >> auVar105;
  iVar83 = auVar76._4_4_ + iVar12 + auVar176._4_4_ >> auVar105;
  iVar89 = auVar76._8_4_ + iVar12 + auVar176._8_4_ >> auVar105;
  iVar96 = auVar76._12_4_ + iVar12 + auVar176._12_4_ >> auVar105;
  auVar41._4_4_ = iVar17;
  auVar41._0_4_ = iVar17;
  auVar41._8_4_ = iVar17;
  auVar41._12_4_ = iVar17;
  iVar218 = auVar222._0_4_ + iVar12 + auVar178._0_4_ >> auVar105;
  iVar225 = auVar222._4_4_ + iVar12 + auVar178._4_4_ >> auVar105;
  iVar228 = auVar222._8_4_ + iVar12 + auVar178._8_4_ >> auVar105;
  iVar231 = auVar222._12_4_ + iVar12 + auVar178._12_4_ >> auVar105;
  iVar164 = auVar166._0_4_ + iVar12 + auVar188._0_4_ >> auVar105;
  iVar168 = auVar166._4_4_ + iVar12 + auVar188._4_4_ >> auVar105;
  iVar170 = auVar166._8_4_ + iVar12 + auVar188._8_4_ >> auVar105;
  iVar172 = auVar166._12_4_ + iVar12 + auVar188._12_4_ >> auVar105;
  iVar17 = auVar50._0_4_ + iVar12 + auVar162._0_4_ >> auVar105;
  iVar53 = auVar50._4_4_ + iVar12 + auVar162._4_4_ >> auVar105;
  iVar59 = auVar50._8_4_ + iVar12 + auVar162._8_4_ >> auVar105;
  iVar65 = auVar50._12_4_ + iVar12 + auVar162._12_4_ >> auVar105;
  auVar4._4_4_ = iVar193;
  auVar4._0_4_ = iVar185;
  auVar4._8_4_ = iVar195;
  auVar4._12_4_ = iVar197;
  auVar76 = pmulld(auVar4,auVar41);
  auVar176 = pmulld(auVar115,auVar140);
  auVar21._4_4_ = iVar61;
  auVar21._0_4_ = iVar61;
  auVar21._8_4_ = iVar61;
  auVar21._12_4_ = iVar61;
  auVar188 = pmulld(auVar115,auVar21);
  auVar50 = pmulld(auVar4,auVar140);
  iVar200 = auVar76._0_4_ + iVar12 + auVar176._0_4_ >> auVar105;
  iVar207 = auVar76._4_4_ + iVar12 + auVar176._4_4_ >> auVar105;
  iVar209 = auVar76._8_4_ + iVar12 + auVar176._8_4_ >> auVar105;
  iVar211 = auVar76._12_4_ + iVar12 + auVar176._12_4_ >> auVar105;
  auVar116._4_4_ = iVar16;
  auVar116._0_4_ = iVar16;
  auVar116._8_4_ = iVar16;
  auVar116._12_4_ = iVar16;
  iVar186 = auVar50._0_4_ + iVar12 + auVar188._0_4_ >> auVar105;
  iVar194 = auVar50._4_4_ + iVar12 + auVar188._4_4_ >> auVar105;
  iVar196 = auVar50._8_4_ + iVar12 + auVar188._8_4_ >> auVar105;
  iVar198 = auVar50._12_4_ + iVar12 + auVar188._12_4_ >> auVar105;
  auVar5._4_4_ = iVar242;
  auVar5._0_4_ = iVar234;
  auVar5._8_4_ = iVar246;
  auVar5._12_4_ = iVar250;
  auVar50 = pmulld(auVar116,auVar5);
  auVar7._4_4_ = iVar206;
  auVar7._0_4_ = iVar199;
  auVar7._8_4_ = iVar208;
  auVar7._12_4_ = iVar210;
  auVar188 = pmulld(auVar7,auVar41);
  auVar176 = pmulld(auVar5,auVar41);
  auVar76 = pmulld(auVar7,auVar140);
  iVar109 = auVar50._0_4_ + iVar12 + auVar188._0_4_ >> auVar105;
  iVar117 = auVar50._4_4_ + iVar12 + auVar188._4_4_ >> auVar105;
  iVar122 = auVar50._8_4_ + iVar12 + auVar188._8_4_ >> auVar105;
  iVar127 = auVar50._12_4_ + iVar12 + auVar188._12_4_ >> auVar105;
  iVar219 = auVar76._0_4_ + iVar12 + auVar176._0_4_ >> auVar105;
  iVar226 = auVar76._4_4_ + iVar12 + auVar176._4_4_ >> auVar105;
  iVar229 = auVar76._8_4_ + iVar12 + auVar176._8_4_ >> auVar105;
  iVar232 = auVar76._12_4_ + iVar12 + auVar176._12_4_ >> auVar105;
  auVar22._4_4_ = iVar67;
  auVar22._0_4_ = iVar67;
  auVar22._8_4_ = iVar67;
  auVar22._12_4_ = iVar67;
  auVar78._12_4_ = uStack_22c;
  auVar78._0_12_ = *(undefined1 (*) [12])*in;
  auVar176 = pmulld(auVar78,auVar22);
  iVar104 = auVar176._0_4_ + iVar12 >> auVar105;
  iVar106 = auVar176._4_4_ + iVar12 >> auVar105;
  iVar107 = auVar176._8_4_ + iVar12 >> auVar105;
  iVar108 = auVar176._12_4_ + iVar12 >> auVar105;
  auVar23._4_4_ = iVar45;
  auVar23._0_4_ = iVar45;
  auVar23._8_4_ = iVar45;
  auVar23._12_4_ = iVar45;
  auVar239._4_4_ = iVar11;
  auVar239._0_4_ = iVar11;
  auVar239._8_4_ = iVar11;
  auVar239._12_4_ = iVar11;
  auVar224._4_4_ = iVar167;
  auVar224._0_4_ = iVar163;
  auVar224._8_4_ = iVar169;
  auVar224._12_4_ = iVar171;
  auVar176 = pmulld(auVar224,auVar239);
  auVar3._4_4_ = iVar52;
  auVar3._0_4_ = iVar13;
  auVar3._8_4_ = iVar58;
  auVar3._12_4_ = iVar64;
  auVar76 = pmulld(auVar3,auVar23);
  auVar42._4_4_ = iVar134;
  auVar42._0_4_ = iVar134;
  auVar42._8_4_ = iVar134;
  auVar42._12_4_ = iVar134;
  auVar50 = pmulld(auVar224,auVar23);
  auVar188 = pmulld(auVar3,auVar42);
  auVar43._4_4_ = iVar8;
  auVar43._0_4_ = iVar8;
  auVar43._8_4_ = iVar8;
  auVar43._12_4_ = iVar8;
  iVar45 = auVar76._0_4_ + iVar12 + auVar176._0_4_ >> auVar105;
  iVar54 = auVar76._4_4_ + iVar12 + auVar176._4_4_ >> auVar105;
  iVar60 = auVar76._8_4_ + iVar12 + auVar176._8_4_ >> auVar105;
  iVar66 = auVar76._12_4_ + iVar12 + auVar176._12_4_ >> auVar105;
  iVar16 = auVar50._0_4_ + iVar12 + auVar188._0_4_ >> auVar105;
  iVar143 = auVar50._4_4_ + iVar12 + auVar188._4_4_ >> auVar105;
  iVar148 = auVar50._8_4_ + iVar12 + auVar188._8_4_ >> auVar105;
  iVar153 = auVar50._12_4_ + iVar12 + auVar188._12_4_ >> auVar105;
  auVar241._4_4_ = iVar25;
  auVar241._0_4_ = iVar18;
  auVar241._8_4_ = iVar27;
  auVar241._12_4_ = iVar32;
  auVar76 = pmulld(auVar241,auVar43);
  auVar50 = pmulld(local_168,auVar239);
  auVar188 = pmulld(auVar241,auVar239);
  auVar176 = pmulld(local_168,auVar23);
  iVar173 = auVar76._0_4_ + iVar12 + auVar50._0_4_ >> auVar105;
  iVar179 = auVar76._4_4_ + iVar12 + auVar50._4_4_ >> auVar105;
  iVar181 = auVar76._8_4_ + iVar12 + auVar50._8_4_ >> auVar105;
  iVar183 = auVar76._12_4_ + iVar12 + auVar50._12_4_ >> auVar105;
  iVar8 = auVar176._0_4_ + iVar12 + auVar188._0_4_ >> auVar105;
  iVar11 = auVar176._4_4_ + iVar12 + auVar188._4_4_ >> auVar105;
  iVar14 = auVar176._8_4_ + iVar12 + auVar188._8_4_ >> auVar105;
  iVar15 = auVar176._12_4_ + iVar12 + auVar188._12_4_ >> auVar105;
  iVar134 = auVar161._0_4_ + auVar202._0_4_;
  iVar144 = auVar161._4_4_ + auVar202._4_4_;
  iVar149 = auVar161._8_4_ + auVar202._8_4_;
  iVar154 = auVar161._12_4_ + auVar202._12_4_;
  iVar236 = auVar202._0_4_ - auVar161._0_4_;
  iVar244 = auVar202._4_4_ - auVar161._4_4_;
  iVar248 = auVar202._8_4_ - auVar161._8_4_;
  iVar252 = auVar202._12_4_ - auVar161._12_4_;
  iVar46 = iVar164 + iVar70;
  iVar55 = iVar168 + iVar83;
  iVar61 = iVar170 + iVar89;
  iVar67 = iVar172 + iVar96;
  iVar70 = iVar70 - iVar164;
  iVar83 = iVar83 - iVar168;
  iVar89 = iVar89 - iVar170;
  iVar96 = iVar96 - iVar172;
  uVar135 = (uint)(iVar134 < local_248) * local_248 | (uint)(iVar134 >= local_248) * iVar134;
  uVar145 = (uint)(iVar144 < local_248) * local_248 | (uint)(iVar144 >= local_248) * iVar144;
  uVar150 = (uint)(iVar149 < local_248) * local_248 | (uint)(iVar149 >= local_248) * iVar149;
  uVar155 = (uint)(iVar154 < local_248) * local_248 | (uint)(iVar154 >= local_248) * iVar154;
  uVar136 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uVar146 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uVar151 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uVar156 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar236 < local_248) * local_248 | (uint)(iVar236 >= local_248) * iVar236;
  uVar145 = (uint)(iVar244 < local_248) * local_248 | (uint)(iVar244 >= local_248) * iVar244;
  uVar150 = (uint)(iVar248 < local_248) * local_248 | (uint)(iVar248 >= local_248) * iVar248;
  uVar155 = (uint)(iVar252 < local_248) * local_248 | (uint)(iVar252 >= local_248) * iVar252;
  auVar240._0_4_ =
       (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  auVar240._4_4_ =
       (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  auVar240._8_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  auVar240._12_4_ =
       (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  uVar150 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar155 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar47 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uVar56 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uVar62 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uVar68 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar71 = (uint)(iVar70 < local_248) * local_248 | (uint)(iVar70 >= local_248) * iVar70;
  uVar84 = (uint)(iVar83 < local_248) * local_248 | (uint)(iVar83 >= local_248) * iVar83;
  uVar90 = (uint)(iVar89 < local_248) * local_248 | (uint)(iVar89 >= local_248) * iVar89;
  uVar97 = (uint)(iVar96 < local_248) * local_248 | (uint)(iVar96 >= local_248) * iVar96;
  iVar46 = iVar185 + iVar234;
  iVar55 = iVar193 + iVar242;
  iVar61 = iVar195 + iVar246;
  iVar67 = iVar197 + iVar250;
  iVar234 = iVar234 - iVar185;
  iVar242 = iVar242 - iVar193;
  iVar246 = iVar246 - iVar195;
  iVar250 = iVar250 - iVar197;
  iVar134 = iVar109 + iVar200;
  iVar70 = iVar117 + iVar207;
  iVar83 = iVar122 + iVar209;
  iVar89 = iVar127 + iVar211;
  iVar109 = iVar109 - iVar200;
  iVar117 = iVar117 - iVar207;
  iVar122 = iVar122 - iVar209;
  iVar127 = iVar127 - iVar211;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  uVar150 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar155 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar135 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uVar26 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uVar28 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uVar33 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar48 = (uint)(iVar234 < local_248) * local_248 | (uint)(iVar234 >= local_248) * iVar234;
  uVar57 = (uint)(iVar242 < local_248) * local_248 | (uint)(iVar242 >= local_248) * iVar242;
  uVar63 = (uint)(iVar246 < local_248) * local_248 | (uint)(iVar246 >= local_248) * iVar246;
  uVar69 = (uint)(iVar250 < local_248) * local_248 | (uint)(iVar250 >= local_248) * iVar250;
  uVar145 = (uint)(iVar134 < local_248) * local_248 | (uint)(iVar134 >= local_248) * iVar134;
  uVar150 = (uint)(iVar70 < local_248) * local_248 | (uint)(iVar70 >= local_248) * iVar70;
  uVar155 = (uint)(iVar83 < local_248) * local_248 | (uint)(iVar83 >= local_248) * iVar83;
  uVar98 = (uint)(iVar89 < local_248) * local_248 | (uint)(iVar89 >= local_248) * iVar89;
  uVar72 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uVar85 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uVar91 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar99 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uVar110 = (uint)(iVar109 < local_248) * local_248 | (uint)(iVar109 >= local_248) * iVar109;
  uVar118 = (uint)(iVar117 < local_248) * local_248 | (uint)(iVar117 >= local_248) * iVar117;
  uVar123 = (uint)(iVar122 < local_248) * local_248 | (uint)(iVar122 >= local_248) * iVar122;
  uVar128 = (uint)(iVar127 < local_248) * local_248 | (uint)(iVar127 >= local_248) * iVar127;
  iVar134 = auVar115._0_4_ + iVar199;
  iVar234 = auVar115._4_4_ + iVar206;
  iVar242 = auVar115._8_4_ + iVar208;
  iVar246 = auVar115._12_4_ + iVar210;
  iVar199 = iVar199 - auVar115._0_4_;
  iVar206 = iVar206 - auVar115._4_4_;
  iVar208 = iVar208 - auVar115._8_4_;
  iVar210 = iVar210 - auVar115._12_4_;
  iVar46 = iVar219 + iVar186;
  iVar55 = iVar226 + iVar194;
  iVar61 = iVar229 + iVar196;
  iVar67 = iVar232 + iVar198;
  iVar219 = iVar219 - iVar186;
  iVar226 = iVar226 - iVar194;
  iVar229 = iVar229 - iVar196;
  iVar232 = iVar232 - iVar198;
  uVar145 = (uint)(iVar134 < local_248) * local_248 | (uint)(iVar134 >= local_248) * iVar134;
  uVar150 = (uint)(iVar234 < local_248) * local_248 | (uint)(iVar234 >= local_248) * iVar234;
  uVar155 = (uint)(iVar242 < local_248) * local_248 | (uint)(iVar242 >= local_248) * iVar242;
  uVar98 = (uint)(iVar246 < local_248) * local_248 | (uint)(iVar246 >= local_248) * iVar246;
  uVar111 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uVar119 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uVar124 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar129 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uVar145 = (uint)(iVar199 < local_248) * local_248 | (uint)(iVar199 >= local_248) * iVar199;
  uVar98 = (uint)(iVar206 < local_248) * local_248 | (uint)(iVar206 >= local_248) * iVar206;
  uVar29 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uVar34 = (uint)(iVar210 < local_248) * local_248 | (uint)(iVar210 >= local_248) * iVar210;
  uVar150 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar155 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  uVar92 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar100 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar73 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uVar86 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar93 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar101 = (uint)(local_258 < (int)uVar100) * local_258 | (local_258 >= (int)uVar100) * uVar100;
  uVar150 = (uint)(iVar219 < local_248) * local_248 | (uint)(iVar219 >= local_248) * iVar219;
  uVar155 = (uint)(iVar226 < local_248) * local_248 | (uint)(iVar226 >= local_248) * iVar226;
  uVar92 = (uint)(iVar229 < local_248) * local_248 | (uint)(iVar229 >= local_248) * iVar229;
  uVar100 = (uint)(iVar232 < local_248) * local_248 | (uint)(iVar232 >= local_248) * iVar232;
  auVar223._0_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  auVar223._4_4_ =
       (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  auVar223._8_4_ = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92
  ;
  auVar223._12_4_ =
       (uint)(local_258 < (int)uVar100) * local_258 | (local_258 >= (int)uVar100) * uVar100;
  iVar46 = auVar139._0_4_ + auVar177._0_4_;
  iVar55 = auVar139._4_4_ + auVar177._4_4_;
  iVar61 = auVar139._8_4_ + auVar177._8_4_;
  iVar67 = auVar139._12_4_ + auVar177._12_4_;
  iVar210 = auVar177._0_4_ - auVar139._0_4_;
  iVar234 = auVar177._4_4_ - auVar139._4_4_;
  iVar242 = auVar177._8_4_ - auVar139._8_4_;
  iVar246 = auVar177._12_4_ - auVar139._12_4_;
  iVar134 = iVar17 + iVar218;
  iVar199 = iVar53 + iVar225;
  iVar206 = iVar59 + iVar228;
  iVar208 = iVar65 + iVar231;
  iVar218 = iVar218 - iVar17;
  iVar225 = iVar225 - iVar53;
  iVar228 = iVar228 - iVar59;
  iVar231 = iVar231 - iVar65;
  uVar150 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar155 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  uVar92 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar100 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar74 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uVar87 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar94 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar102 = (uint)(local_258 < (int)uVar100) * local_258 | (local_258 >= (int)uVar100) * uVar100;
  uVar150 = (uint)(iVar210 < local_248) * local_248 | (uint)(iVar210 >= local_248) * iVar210;
  uVar155 = (uint)(iVar234 < local_248) * local_248 | (uint)(iVar234 >= local_248) * iVar234;
  uVar92 = (uint)(iVar242 < local_248) * local_248 | (uint)(iVar242 >= local_248) * iVar242;
  uVar100 = (uint)(iVar246 < local_248) * local_248 | (uint)(iVar246 >= local_248) * iVar246;
  auVar190._0_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  auVar190._4_4_ =
       (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  auVar190._8_4_ = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92
  ;
  auVar190._12_4_ =
       (uint)(local_258 < (int)uVar100) * local_258 | (local_258 >= (int)uVar100) * uVar100;
  uVar150 = (uint)(iVar134 < local_248) * local_248 | (uint)(iVar134 >= local_248) * iVar134;
  uVar155 = (uint)(iVar199 < local_248) * local_248 | (uint)(iVar199 >= local_248) * iVar199;
  uVar92 = (uint)(iVar206 < local_248) * local_248 | (uint)(iVar206 >= local_248) * iVar206;
  uVar100 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uVar112 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uVar120 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar125 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar130 = (uint)(local_258 < (int)uVar100) * local_258 | (local_258 >= (int)uVar100) * uVar100;
  uVar150 = (uint)(iVar218 < local_248) * local_248 | (uint)(iVar218 >= local_248) * iVar218;
  uVar155 = (uint)(iVar225 < local_248) * local_248 | (uint)(iVar225 >= local_248) * iVar225;
  uVar92 = (uint)(iVar228 < local_248) * local_248 | (uint)(iVar228 >= local_248) * iVar228;
  uVar100 = (uint)(iVar231 < local_248) * local_248 | (uint)(iVar231 >= local_248) * iVar231;
  auVar141._0_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  auVar141._4_4_ =
       (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  auVar141._8_4_ = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92
  ;
  auVar141._12_4_ =
       (uint)(local_258 < (int)uVar100) * local_258 | (local_258 >= (int)uVar100) * uVar100;
  auVar24._4_4_ = iVar10;
  auVar24._0_4_ = iVar10;
  auVar24._8_4_ = iVar10;
  auVar24._12_4_ = iVar10;
  auVar142._4_4_ = iVar243;
  auVar142._0_4_ = iVar235;
  auVar142._8_4_ = iVar247;
  auVar142._12_4_ = iVar251;
  auVar191._4_4_ = iVar215;
  auVar191._0_4_ = iVar212;
  auVar191._8_4_ = iVar216;
  auVar191._12_4_ = iVar217;
  auVar205._0_4_ = iVar212 + iVar235;
  auVar205._4_4_ = iVar215 + iVar243;
  auVar205._8_4_ = iVar216 + iVar247;
  auVar205._12_4_ = iVar217 + iVar251;
  auVar176 = pmulld(auVar142,auVar24);
  auVar188 = pmulld(auVar191,auVar22);
  iVar149 = auVar188._0_4_ + iVar12 + auVar176._0_4_ >> auVar105;
  iVar228 = auVar188._4_4_ + iVar12 + auVar176._4_4_ >> auVar105;
  iVar154 = auVar188._8_4_ + iVar12 + auVar176._8_4_ >> auVar105;
  iVar231 = auVar188._12_4_ + iVar12 + auVar176._12_4_ >> auVar105;
  auVar176 = pmulld(auVar205,auVar22);
  iVar55 = auVar176._0_4_ + iVar12 >> auVar105;
  iVar67 = auVar176._4_4_ + iVar12 >> auVar105;
  iVar134 = auVar176._8_4_ + iVar12 >> auVar105;
  iVar199 = auVar176._12_4_ + iVar12 >> auVar105;
  iVar46 = iVar18 + iVar163;
  iVar61 = iVar25 + iVar167;
  iVar10 = iVar27 + iVar169;
  iVar17 = iVar32 + iVar171;
  iVar163 = iVar163 - iVar18;
  iVar167 = iVar167 - iVar25;
  iVar169 = iVar169 - iVar27;
  iVar171 = iVar171 - iVar32;
  iVar18 = iVar173 + iVar45;
  iVar25 = iVar179 + iVar54;
  iVar206 = iVar181 + iVar60;
  iVar27 = iVar183 + iVar66;
  iVar45 = iVar45 - iVar173;
  iVar54 = iVar54 - iVar179;
  iVar60 = iVar60 - iVar181;
  iVar66 = iVar66 - iVar183;
  uVar150 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar155 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar92 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar100 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar75 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uVar88 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar95 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar103 = (uint)(local_258 < (int)uVar100) * local_258 | (local_258 >= (int)uVar100) * uVar100;
  uVar150 = (uint)(iVar163 < local_248) * local_248 | (uint)(iVar163 >= local_248) * iVar163;
  uVar155 = (uint)(iVar167 < local_248) * local_248 | (uint)(iVar167 >= local_248) * iVar167;
  uVar92 = (uint)(iVar169 < local_248) * local_248 | (uint)(iVar169 >= local_248) * iVar169;
  uVar35 = (uint)(iVar171 < local_248) * local_248 | (uint)(iVar171 >= local_248) * iVar171;
  uVar150 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uVar100 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar30 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar36 = (uint)(local_258 < (int)uVar35) * local_258 | (local_258 >= (int)uVar35) * uVar35;
  uVar155 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  uVar92 = (uint)(iVar25 < local_248) * local_248 | (uint)(iVar25 >= local_248) * iVar25;
  uVar35 = (uint)(iVar206 < local_248) * local_248 | (uint)(iVar206 >= local_248) * iVar206;
  uVar131 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar113 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar121 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar126 = (uint)(local_258 < (int)uVar35) * local_258 | (local_258 >= (int)uVar35) * uVar35;
  uVar132 = (uint)(local_258 < (int)uVar131) * local_258 | (local_258 >= (int)uVar131) * uVar131;
  uVar155 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar92 = (uint)(iVar54 < local_248) * local_248 | (uint)(iVar54 >= local_248) * iVar54;
  uVar131 = (uint)(iVar60 < local_248) * local_248 | (uint)(iVar60 >= local_248) * iVar60;
  uVar37 = (uint)(iVar66 < local_248) * local_248 | (uint)(iVar66 >= local_248) * iVar66;
  uVar155 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar35 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar31 = (uint)(local_258 < (int)uVar131) * local_258 | (local_258 >= (int)uVar131) * uVar131;
  uVar38 = (uint)(local_258 < (int)uVar37) * local_258 | (local_258 >= (int)uVar37) * uVar37;
  iVar163 = local_168._0_4_ + iVar13;
  iVar10 = local_168._4_4_ + iVar52;
  iVar17 = local_168._8_4_ + iVar58;
  iVar25 = local_168._12_4_ + iVar64;
  iVar13 = iVar13 - local_168._0_4_;
  iVar52 = iVar52 - local_168._4_4_;
  iVar58 = iVar58 - local_168._8_4_;
  iVar64 = iVar64 - local_168._12_4_;
  iVar46 = iVar8 + iVar16;
  iVar61 = iVar11 + iVar143;
  iVar45 = iVar14 + iVar148;
  iVar18 = iVar15 + iVar153;
  iVar16 = iVar16 - iVar8;
  iVar143 = iVar143 - iVar11;
  iVar148 = iVar148 - iVar14;
  iVar153 = iVar153 - iVar15;
  auVar178._4_4_ = (uint)(local_258 < (int)uVar84) * local_258 | (local_258 >= (int)uVar84) * uVar84
  ;
  auVar178._0_4_ = (uint)(local_258 < (int)uVar71) * local_258 | (local_258 >= (int)uVar71) * uVar71
  ;
  auVar178._8_4_ = (uint)(local_258 < (int)uVar90) * local_258 | (local_258 >= (int)uVar90) * uVar90
  ;
  auVar178._12_4_ =
       (uint)(local_258 < (int)uVar97) * local_258 | (local_258 >= (int)uVar97) * uVar97;
  auVar176 = pmulld(auVar178,auVar239);
  auVar77 = pmulld(auVar141,auVar23);
  auVar142 = pmulld(auVar178,auVar23);
  auVar178 = pmulld(auVar141,auVar42);
  auVar78 = pmulld(auVar240,auVar239);
  auVar50 = pmulld(auVar190,auVar23);
  auVar191 = pmulld(auVar190,auVar42);
  auVar241 = pmulld(auVar240,auVar23);
  auVar162._4_4_ = (uint)(local_258 < (int)uVar57) * local_258 | (local_258 >= (int)uVar57) * uVar57
  ;
  auVar162._0_4_ = (uint)(local_258 < (int)uVar48) * local_258 | (local_258 >= (int)uVar48) * uVar48
  ;
  auVar162._8_4_ = (uint)(local_258 < (int)uVar63) * local_258 | (local_258 >= (int)uVar63) * uVar63
  ;
  auVar162._12_4_ =
       (uint)(local_258 < (int)uVar69) * local_258 | (local_258 >= (int)uVar69) * uVar69;
  auVar188 = pmulld(auVar162,auVar43);
  auVar222._4_4_ = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98
  ;
  auVar222._0_4_ =
       (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  auVar222._8_4_ = (uint)(local_258 < (int)uVar29) * local_258 | (local_258 >= (int)uVar29) * uVar29
  ;
  auVar222._12_4_ =
       (uint)(local_258 < (int)uVar34) * local_258 | (local_258 >= (int)uVar34) * uVar34;
  auVar76 = pmulld(auVar222,auVar239);
  auVar192 = pmulld(auVar162,auVar239);
  auVar222 = pmulld(auVar222,auVar23);
  auVar166._4_4_ =
       (uint)(local_258 < (int)uVar118) * local_258 | (local_258 >= (int)uVar118) * uVar118;
  auVar166._0_4_ =
       (uint)(local_258 < (int)uVar110) * local_258 | (local_258 >= (int)uVar110) * uVar110;
  auVar166._8_4_ =
       (uint)(local_258 < (int)uVar123) * local_258 | (local_258 >= (int)uVar123) * uVar123;
  auVar166._12_4_ =
       (uint)(local_258 < (int)uVar128) * local_258 | (local_258 >= (int)uVar128) * uVar128;
  auVar79 = pmulld(auVar43,auVar166);
  auVar162 = pmulld(auVar223,auVar239);
  auVar166 = pmulld(auVar166,auVar239);
  auVar224 = pmulld(auVar223,auVar23);
  uVar145 = (uint)(iVar163 < local_248) * local_248 | (uint)(iVar163 >= local_248) * iVar163;
  uVar98 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar92 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar29 = (uint)(iVar25 < local_248) * local_248 | (uint)(iVar25 >= local_248) * iVar25;
  uVar174 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uVar180 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uVar182 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar184 = (uint)(local_258 < (int)uVar29) * local_258 | (local_258 >= (int)uVar29) * uVar29;
  uVar145 = (uint)(iVar13 < local_248) * local_248 | (uint)(iVar13 >= local_248) * iVar13;
  uVar98 = (uint)(iVar52 < local_248) * local_248 | (uint)(iVar52 >= local_248) * iVar52;
  uVar92 = (uint)(iVar58 < local_248) * local_248 | (uint)(iVar58 >= local_248) * iVar58;
  uVar131 = (uint)(iVar64 < local_248) * local_248 | (uint)(iVar64 >= local_248) * iVar64;
  uVar145 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uVar29 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uVar37 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar63 = (uint)(local_258 < (int)uVar131) * local_258 | (local_258 >= (int)uVar131) * uVar131;
  uVar98 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar92 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar131 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar34 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  uVar84 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uVar90 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar97 = (uint)(local_258 < (int)uVar131) * local_258 | (local_258 >= (int)uVar131) * uVar131;
  uVar110 = (uint)(local_258 < (int)uVar34) * local_258 | (local_258 >= (int)uVar34) * uVar34;
  uVar98 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar92 = (uint)(iVar143 < local_248) * local_248 | (uint)(iVar143 >= local_248) * iVar143;
  uVar131 = (uint)(iVar148 < local_248) * local_248 | (uint)(iVar148 >= local_248) * iVar148;
  uVar34 = (uint)(iVar153 < local_248) * local_248 | (uint)(iVar153 >= local_248) * iVar153;
  auVar158._0_4_ = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98
  ;
  auVar158._4_4_ = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92
  ;
  auVar158._8_4_ =
       (uint)(local_258 < (int)uVar131) * local_258 | (local_258 >= (int)uVar131) * uVar131;
  auVar158._12_4_ =
       (uint)(local_258 < (int)uVar34) * local_258 | (local_258 >= (int)uVar34) * uVar34;
  iVar16 = auVar176._0_4_ + iVar12 + auVar77._0_4_ >> auVar105;
  iVar167 = auVar176._4_4_ + iVar12 + auVar77._4_4_ >> auVar105;
  iVar208 = auVar176._8_4_ + iVar12 + auVar77._8_4_ >> auVar105;
  iVar32 = auVar176._12_4_ + iVar12 + auVar77._12_4_ >> auVar105;
  iVar96 = auVar142._0_4_ + iVar12 + auVar178._0_4_ >> auVar105;
  iVar109 = auVar142._4_4_ + iVar12 + auVar178._4_4_ >> auVar105;
  iVar117 = auVar142._8_4_ + iVar12 + auVar178._8_4_ >> auVar105;
  iVar122 = auVar142._12_4_ + iVar12 + auVar178._12_4_ >> auVar105;
  iVar234 = auVar50._0_4_ + iVar12 + auVar78._0_4_ >> auVar105;
  iVar53 = auVar50._4_4_ + iVar12 + auVar78._4_4_ >> auVar105;
  iVar242 = auVar50._8_4_ + iVar12 + auVar78._8_4_ >> auVar105;
  iVar54 = auVar50._12_4_ + iVar12 + auVar78._12_4_ >> auVar105;
  iVar143 = auVar241._0_4_ + iVar12 + auVar191._0_4_ >> auVar105;
  iVar59 = auVar241._4_4_ + iVar12 + auVar191._4_4_ >> auVar105;
  iVar246 = auVar241._8_4_ + iVar12 + auVar191._8_4_ >> auVar105;
  iVar60 = auVar241._12_4_ + iVar12 + auVar191._12_4_ >> auVar105;
  iVar148 = auVar188._0_4_ + iVar12 + auVar76._0_4_ >> auVar105;
  iVar65 = auVar188._4_4_ + iVar12 + auVar76._4_4_ >> auVar105;
  iVar250 = auVar188._8_4_ + iVar12 + auVar76._8_4_ >> auVar105;
  iVar66 = auVar188._12_4_ + iVar12 + auVar76._12_4_ >> auVar105;
  iVar127 = auVar222._0_4_ + iVar12 + auVar192._0_4_ >> auVar105;
  iVar218 = auVar222._4_4_ + iVar12 + auVar192._4_4_ >> auVar105;
  iVar144 = auVar222._8_4_ + iVar12 + auVar192._8_4_ >> auVar105;
  iVar225 = auVar222._12_4_ + iVar12 + auVar192._12_4_ >> auVar105;
  iVar17 = auVar79._0_4_ + iVar12 + auVar162._0_4_ >> auVar105;
  iVar52 = auVar79._4_4_ + iVar12 + auVar162._4_4_ >> auVar105;
  iVar169 = auVar79._8_4_ + iVar12 + auVar162._8_4_ >> auVar105;
  iVar210 = auVar79._12_4_ + iVar12 + auVar162._12_4_ >> auVar105;
  iVar153 = auVar166._0_4_ + iVar12 + auVar224._0_4_ >> auVar105;
  iVar70 = auVar166._4_4_ + iVar12 + auVar224._4_4_ >> auVar105;
  iVar83 = auVar166._8_4_ + iVar12 + auVar224._8_4_ >> auVar105;
  iVar89 = auVar166._12_4_ + iVar12 + auVar224._12_4_ >> auVar105;
  iVar46 = iVar212 + iVar104;
  iVar61 = iVar215 + iVar106;
  iVar45 = iVar216 + iVar107;
  iVar18 = iVar217 + iVar108;
  iVar212 = iVar104 - iVar212;
  iVar215 = iVar106 - iVar215;
  iVar216 = iVar107 - iVar216;
  iVar217 = iVar108 - iVar217;
  uVar98 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar92 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar131 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar34 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  uVar118 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uVar123 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar128 = (uint)(local_258 < (int)uVar131) * local_258 | (local_258 >= (int)uVar131) * uVar131;
  uVar133 = (uint)(local_258 < (int)uVar34) * local_258 | (local_258 >= (int)uVar34) * uVar34;
  uVar98 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar92 = (uint)(iVar215 < local_248) * local_248 | (uint)(iVar215 >= local_248) * iVar215;
  uVar34 = (uint)(iVar216 < local_248) * local_248 | (uint)(iVar216 >= local_248) * iVar216;
  uVar57 = (uint)(iVar217 < local_248) * local_248 | (uint)(iVar217 >= local_248) * iVar217;
  uVar98 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uVar131 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar48 = (uint)(local_258 < (int)uVar34) * local_258 | (local_258 >= (int)uVar34) * uVar34;
  uVar69 = (uint)(local_258 < (int)uVar57) * local_258 | (local_258 >= (int)uVar57) * uVar57;
  iVar46 = iVar104 + iVar55;
  iVar61 = iVar106 + iVar67;
  iVar212 = iVar107 + iVar134;
  iVar45 = iVar108 + iVar199;
  iVar55 = iVar104 - iVar55;
  iVar67 = iVar106 - iVar67;
  iVar134 = iVar107 - iVar134;
  iVar199 = iVar108 - iVar199;
  uVar92 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar34 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar57 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar71 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar137 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar147 = (uint)(local_258 < (int)uVar34) * local_258 | (local_258 >= (int)uVar34) * uVar34;
  uVar152 = (uint)(local_258 < (int)uVar57) * local_258 | (local_258 >= (int)uVar57) * uVar57;
  uVar157 = (uint)(local_258 < (int)uVar71) * local_258 | (local_258 >= (int)uVar71) * uVar71;
  uVar92 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  uVar34 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar57 = (uint)(iVar134 < local_248) * local_248 | (uint)(iVar134 >= local_248) * iVar134;
  uVar71 = (uint)(iVar199 < local_248) * local_248 | (uint)(iVar199 >= local_248) * iVar199;
  uVar92 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uVar34 = (uint)(local_258 < (int)uVar34) * local_258 | (local_258 >= (int)uVar34) * uVar34;
  uVar57 = (uint)(local_258 < (int)uVar57) * local_258 | (local_258 >= (int)uVar57) * uVar57;
  uVar71 = (uint)(local_258 < (int)uVar71) * local_258 | (local_258 >= (int)uVar71) * uVar71;
  iVar46 = iVar104 + iVar149;
  iVar55 = iVar106 + iVar228;
  iVar61 = iVar107 + iVar154;
  iVar212 = iVar108 + iVar231;
  iVar149 = iVar104 - iVar149;
  iVar228 = iVar106 - iVar228;
  iVar154 = iVar107 - iVar154;
  iVar231 = iVar108 - iVar231;
  uVar220 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar227 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  uVar230 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar233 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar221 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar227 = (uint)(local_258 < (int)uVar227) * local_258 | (local_258 >= (int)uVar227) * uVar227;
  uVar230 = (uint)(local_258 < (int)uVar230) * local_258 | (local_258 >= (int)uVar230) * uVar230;
  uVar233 = (uint)(local_258 < (int)uVar233) * local_258 | (local_258 >= (int)uVar233) * uVar233;
  uVar220 = (uint)(iVar149 < local_248) * local_248 | (uint)(iVar149 >= local_248) * iVar149;
  uVar245 = (uint)(iVar228 < local_248) * local_248 | (uint)(iVar228 >= local_248) * iVar228;
  uVar249 = (uint)(iVar154 < local_248) * local_248 | (uint)(iVar154 >= local_248) * iVar154;
  uVar253 = (uint)(iVar231 < local_248) * local_248 | (uint)(iVar231 >= local_248) * iVar231;
  uVar237 = (uint)(local_258 < (int)uVar220) * local_258 | (local_258 >= (int)uVar220) * uVar220;
  uVar245 = (uint)(local_258 < (int)uVar245) * local_258 | (local_258 >= (int)uVar245) * uVar245;
  uVar249 = (uint)(local_258 < (int)uVar249) * local_258 | (local_258 >= (int)uVar249) * uVar249;
  uVar253 = (uint)(local_258 < (int)uVar253) * local_258 | (local_258 >= (int)uVar253) * uVar253;
  iVar55 = iVar235 + iVar104;
  iVar61 = iVar243 + iVar106;
  iVar45 = iVar247 + iVar107;
  iVar134 = iVar251 + iVar108;
  iVar104 = iVar104 - iVar235;
  iVar106 = iVar106 - iVar243;
  iVar107 = iVar107 - iVar247;
  iVar108 = iVar108 - iVar251;
  auVar50._4_4_ = uVar35;
  auVar50._0_4_ = uVar155;
  auVar50._8_4_ = uVar31;
  auVar50._12_4_ = uVar38;
  auVar159._0_4_ = auVar158._0_4_ + uVar155;
  auVar159._4_4_ = auVar158._4_4_ + uVar35;
  auVar159._8_4_ = auVar158._8_4_ + uVar31;
  auVar159._12_4_ = auVar158._12_4_ + uVar38;
  auVar76 = pmulld(auVar50,auVar24);
  auVar188 = pmulld(auVar158,auVar22);
  auVar176._4_4_ = uVar29;
  auVar176._0_4_ = uVar145;
  auVar176._8_4_ = uVar37;
  auVar176._12_4_ = uVar63;
  auVar77._4_4_ = uVar100;
  auVar77._0_4_ = uVar150;
  auVar77._8_4_ = uVar30;
  auVar77._12_4_ = uVar36;
  auVar50 = pmulld(auVar77,auVar24);
  auVar162 = pmulld(auVar176,auVar22);
  iVar212 = uVar135 + uVar136;
  iVar18 = uVar26 + uVar146;
  iVar10 = uVar28 + uVar151;
  iVar15 = uVar33 + uVar156;
  iVar46 = uVar136 - uVar135;
  iVar67 = uVar146 - uVar26;
  iVar199 = uVar151 - uVar28;
  iVar11 = uVar156 - uVar33;
  uVar135 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  uVar155 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar26 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar35 = (uint)(iVar134 < local_248) * local_248 | (uint)(iVar134 >= local_248) * iVar134;
  uVar31 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uVar33 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar38 = (uint)(local_258 < (int)uVar26) * local_258 | (local_258 >= (int)uVar26) * uVar26;
  uVar136 = (uint)(local_258 < (int)uVar35) * local_258 | (local_258 >= (int)uVar35) * uVar35;
  uVar135 = (uint)(iVar104 < local_248) * local_248 | (uint)(iVar104 >= local_248) * iVar104;
  uVar155 = (uint)(iVar106 < local_248) * local_248 | (uint)(iVar106 >= local_248) * iVar106;
  uVar26 = (uint)(iVar107 < local_248) * local_248 | (uint)(iVar107 >= local_248) * iVar107;
  uVar35 = (uint)(iVar108 < local_248) * local_248 | (uint)(iVar108 >= local_248) * iVar108;
  uVar146 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uVar151 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar156 = (uint)(local_258 < (int)uVar26) * local_258 | (local_258 >= (int)uVar26) * uVar26;
  uVar220 = (uint)(local_258 < (int)uVar35) * local_258 | (local_258 >= (int)uVar35) * uVar35;
  iVar55 = auVar188._0_4_ + iVar12 + auVar76._0_4_ >> auVar105;
  iVar45 = auVar188._4_4_ + iVar12 + auVar76._4_4_ >> auVar105;
  iVar163 = auVar188._8_4_ + iVar12 + auVar76._8_4_ >> auVar105;
  iVar13 = auVar188._12_4_ + iVar12 + auVar76._12_4_ >> auVar105;
  auVar176 = pmulld(auVar159,auVar22);
  iVar25 = auVar176._0_4_ + iVar12 >> auVar105;
  iVar215 = auVar176._4_4_ + iVar12 >> auVar105;
  iVar58 = auVar176._8_4_ + iVar12 >> auVar105;
  iVar171 = auVar176._12_4_ + iVar12 >> auVar105;
  iVar217 = auVar162._0_4_ + iVar12 + auVar50._0_4_ >> auVar105;
  iVar104 = auVar162._4_4_ + iVar12 + auVar50._4_4_ >> auVar105;
  iVar106 = auVar162._8_4_ + iVar12 + auVar50._8_4_ >> auVar105;
  iVar107 = auVar162._12_4_ + iVar12 + auVar50._12_4_ >> auVar105;
  auVar188._4_4_ = uVar29 + uVar100;
  auVar188._0_4_ = uVar145 + uVar150;
  auVar188._8_4_ = uVar37 + uVar30;
  auVar188._12_4_ = uVar63 + uVar36;
  auVar176 = pmulld(auVar188,auVar22);
  iVar61 = auVar176._0_4_ + iVar12 >> auVar105;
  iVar134 = auVar176._4_4_ + iVar12 >> auVar105;
  iVar8 = auVar176._8_4_ + iVar12 >> auVar105;
  iVar14 = auVar176._12_4_ + iVar12 >> auVar105;
  uVar135 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar145 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  uVar150 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar155 = (uint)(iVar15 < local_248) * local_248 | (uint)(iVar15 >= local_248) * iVar15;
  uStack_134 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  local_138 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_130 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_12c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar206 = uVar72 + uVar47;
  iVar27 = uVar85 + uVar56;
  iVar216 = uVar91 + uVar62;
  iVar64 = uVar99 + uVar68;
  iVar212 = uVar47 - uVar72;
  iVar18 = uVar56 - uVar85;
  iVar10 = uVar62 - uVar91;
  iVar15 = uVar68 - uVar99;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar150 = (uint)(iVar199 < local_248) * local_248 | (uint)(iVar199 >= local_248) * iVar199;
  uVar155 = (uint)(iVar11 < local_248) * local_248 | (uint)(iVar11 >= local_248) * iVar11;
  uVar26 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uVar100 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uVar35 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uVar28 = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar206 < local_248) * local_248 | (uint)(iVar206 >= local_248) * iVar206;
  uVar145 = (uint)(iVar27 < local_248) * local_248 | (uint)(iVar27 >= local_248) * iVar27;
  uVar150 = (uint)(iVar216 < local_248) * local_248 | (uint)(iVar216 >= local_248) * iVar216;
  uVar155 = (uint)(iVar64 < local_248) * local_248 | (uint)(iVar64 >= local_248) * iVar64;
  uStack_124 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  local_128 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_120 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_11c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = iVar17 + iVar16;
  iVar67 = iVar52 + iVar167;
  iVar199 = iVar169 + iVar208;
  iVar11 = iVar210 + iVar32;
  iVar16 = iVar16 - iVar17;
  iVar167 = iVar167 - iVar52;
  iVar208 = iVar208 - iVar169;
  iVar32 = iVar32 - iVar210;
  uVar135 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar145 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  uVar150 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar155 = (uint)(iVar15 < local_248) * local_248 | (uint)(iVar15 >= local_248) * iVar15;
  local_398._0_4_ =
       (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  local_398._4_4_ =
       (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  local_398._8_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  local_398._12_4_ =
       (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar150 = (uint)(iVar199 < local_248) * local_248 | (uint)(iVar199 >= local_248) * iVar199;
  uVar155 = (uint)(iVar11 < local_248) * local_248 | (uint)(iVar11 >= local_248) * iVar11;
  uStack_114 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  local_118 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_110 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_10c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = iVar148 + iVar234;
  iVar212 = iVar65 + iVar53;
  iVar67 = iVar250 + iVar242;
  iVar18 = iVar66 + iVar54;
  iVar234 = iVar234 - iVar148;
  iVar53 = iVar53 - iVar65;
  iVar242 = iVar242 - iVar250;
  iVar54 = iVar54 - iVar66;
  uVar135 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar145 = (uint)(iVar167 < local_248) * local_248 | (uint)(iVar167 >= local_248) * iVar167;
  uVar150 = (uint)(iVar208 < local_248) * local_248 | (uint)(iVar208 >= local_248) * iVar208;
  uVar155 = (uint)(iVar32 < local_248) * local_248 | (uint)(iVar32 >= local_248) * iVar32;
  local_418._0_4_ =
       (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  local_418._4_4_ =
       (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  local_418._8_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  local_418._12_4_ =
       (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar150 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar155 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  uStack_104 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  local_108 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_100 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_fc = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = uVar74 + uVar111;
  iVar212 = uVar87 + uVar119;
  iVar67 = uVar94 + uVar124;
  iVar18 = uVar102 + uVar129;
  iVar16 = uVar74 - uVar111;
  iVar17 = uVar87 - uVar119;
  iVar206 = uVar94 - uVar124;
  iVar167 = uVar102 - uVar129;
  uVar135 = (uint)(iVar234 < local_248) * local_248 | (uint)(iVar234 >= local_248) * iVar234;
  uVar145 = (uint)(iVar53 < local_248) * local_248 | (uint)(iVar53 >= local_248) * iVar53;
  uVar150 = (uint)(iVar242 < local_248) * local_248 | (uint)(iVar242 >= local_248) * iVar242;
  uVar155 = (uint)(iVar54 < local_248) * local_248 | (uint)(iVar54 >= local_248) * iVar54;
  auVar51._0_4_ =
       (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  auVar51._4_4_ =
       (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  auVar51._8_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  auVar51._12_4_ =
       (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar150 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar155 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  uStack_44 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  local_48 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_40 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_3c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = uVar73 + uVar112;
  iVar212 = uVar86 + uVar120;
  iVar67 = uVar93 + uVar125;
  iVar18 = uVar101 + uVar130;
  iVar199 = uVar112 - uVar73;
  iVar10 = uVar120 - uVar86;
  iVar11 = uVar125 - uVar93;
  iVar15 = uVar130 - uVar101;
  uVar135 = (uint)(iVar16 < local_248) * local_248 | (uint)(iVar16 >= local_248) * iVar16;
  uVar145 = (uint)(iVar17 < local_248) * local_248 | (uint)(iVar17 >= local_248) * iVar17;
  uVar150 = (uint)(iVar206 < local_248) * local_248 | (uint)(iVar206 >= local_248) * iVar206;
  uVar155 = (uint)(iVar167 < local_248) * local_248 | (uint)(iVar167 >= local_248) * iVar167;
  local_428._0_4_ =
       (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  local_428._4_4_ =
       (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  local_428._8_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  local_428._12_4_ =
       (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar150 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar155 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  uStack_54 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  local_58 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_50 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_4c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = iVar153 + iVar96;
  iVar212 = iVar70 + iVar109;
  iVar67 = iVar83 + iVar117;
  iVar18 = iVar89 + iVar122;
  iVar96 = iVar96 - iVar153;
  iVar109 = iVar109 - iVar70;
  iVar117 = iVar117 - iVar83;
  iVar122 = iVar122 - iVar89;
  uVar135 = (uint)(iVar199 < local_248) * local_248 | (uint)(iVar199 >= local_248) * iVar199;
  uVar145 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar150 = (uint)(iVar11 < local_248) * local_248 | (uint)(iVar11 >= local_248) * iVar11;
  uVar155 = (uint)(iVar15 < local_248) * local_248 | (uint)(iVar15 >= local_248) * iVar15;
  local_3a8._0_4_ =
       (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  local_3a8._4_4_ =
       (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  local_3a8._8_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  local_3a8._12_4_ =
       (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar150 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar155 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  uStack_64 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  local_68 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_60 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_5c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = iVar127 + iVar143;
  iVar212 = iVar218 + iVar59;
  iVar67 = iVar144 + iVar246;
  iVar18 = iVar225 + iVar60;
  iVar143 = iVar143 - iVar127;
  iVar59 = iVar59 - iVar218;
  iVar246 = iVar246 - iVar144;
  iVar60 = iVar60 - iVar225;
  uVar135 = (uint)(iVar96 < local_248) * local_248 | (uint)(iVar96 >= local_248) * iVar96;
  uVar145 = (uint)(iVar109 < local_248) * local_248 | (uint)(iVar109 >= local_248) * iVar109;
  uVar150 = (uint)(iVar117 < local_248) * local_248 | (uint)(iVar117 >= local_248) * iVar117;
  uVar155 = (uint)(iVar122 < local_248) * local_248 | (uint)(iVar122 >= local_248) * iVar122;
  auVar213._0_4_ =
       (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  auVar213._4_4_ =
       (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  auVar213._8_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  auVar213._12_4_ =
       (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar150 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar155 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  uStack_74 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  local_78 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_70 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_6c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = uVar118 + uVar174;
  iVar212 = uVar123 + uVar180;
  iVar67 = uVar128 + uVar182;
  iVar18 = uVar133 + uVar184;
  iVar199 = uVar118 - uVar174;
  iVar10 = uVar123 - uVar180;
  iVar11 = uVar128 - uVar182;
  iVar15 = uVar133 - uVar184;
  uVar135 = (uint)(iVar143 < local_248) * local_248 | (uint)(iVar143 >= local_248) * iVar143;
  uVar145 = (uint)(iVar59 < local_248) * local_248 | (uint)(iVar59 >= local_248) * iVar59;
  uVar150 = (uint)(iVar246 < local_248) * local_248 | (uint)(iVar246 >= local_248) * iVar246;
  uVar155 = (uint)(iVar60 < local_248) * local_248 | (uint)(iVar60 >= local_248) * iVar60;
  auVar80._0_4_ =
       (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  auVar80._4_4_ =
       (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  auVar80._8_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  auVar80._12_4_ =
       (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar150 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar155 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  local_238 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_234 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_230 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_22c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar199 < local_248) * local_248 | (uint)(iVar199 >= local_248) * iVar199;
  uVar145 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar150 = (uint)(iVar11 < local_248) * local_248 | (uint)(iVar11 >= local_248) * iVar11;
  uVar155 = (uint)(iVar15 < local_248) * local_248 | (uint)(iVar15 >= local_248) * iVar15;
  local_148 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_144 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_140 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_13c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = uVar137 + uVar84;
  iVar212 = uVar147 + uVar90;
  iVar67 = uVar152 + uVar97;
  iVar18 = uVar157 + uVar110;
  iVar199 = uVar137 - uVar84;
  iVar10 = uVar147 - uVar90;
  iVar11 = uVar152 - uVar97;
  iVar15 = uVar157 - uVar110;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar150 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar155 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  local_228 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_224 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_220 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_21c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar199 < local_248) * local_248 | (uint)(iVar199 >= local_248) * iVar199;
  uVar145 = (uint)(iVar10 < local_248) * local_248 | (uint)(iVar10 >= local_248) * iVar10;
  uVar150 = (uint)(iVar11 < local_248) * local_248 | (uint)(iVar11 >= local_248) * iVar11;
  uVar155 = (uint)(iVar15 < local_248) * local_248 | (uint)(iVar15 >= local_248) * iVar15;
  local_158 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_154 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_150 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_14c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = iVar25 + uVar221;
  iVar212 = iVar215 + uVar227;
  iVar67 = iVar58 + uVar230;
  iVar18 = iVar171 + uVar233;
  iVar25 = uVar221 - iVar25;
  iVar215 = uVar227 - iVar215;
  iVar58 = uVar230 - iVar58;
  iVar171 = uVar233 - iVar171;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar150 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar155 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  local_218 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_214 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_210 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_20c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar25 < local_248) * local_248 | (uint)(iVar25 >= local_248) * iVar25;
  uVar145 = (uint)(iVar215 < local_248) * local_248 | (uint)(iVar215 >= local_248) * iVar215;
  uVar150 = (uint)(iVar58 < local_248) * local_248 | (uint)(iVar58 >= local_248) * iVar58;
  uVar155 = (uint)(iVar171 < local_248) * local_248 | (uint)(iVar171 >= local_248) * iVar171;
  local_168._4_4_ =
       (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  local_168._0_4_ =
       (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  local_168._8_4_ =
       (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  local_168._12_4_ =
       (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = iVar61 + uVar31;
  iVar212 = iVar134 + uVar33;
  iVar67 = iVar8 + uVar38;
  iVar18 = iVar14 + uVar136;
  iVar61 = uVar31 - iVar61;
  iVar134 = uVar33 - iVar134;
  iVar8 = uVar38 - iVar8;
  iVar14 = uVar136 - iVar14;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar150 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar155 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  local_208 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_204 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_200 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_1fc = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar145 = (uint)(iVar134 < local_248) * local_248 | (uint)(iVar134 >= local_248) * iVar134;
  uVar150 = (uint)(iVar8 < local_248) * local_248 | (uint)(iVar8 >= local_248) * iVar8;
  uVar155 = (uint)(iVar14 < local_248) * local_248 | (uint)(iVar14 >= local_248) * iVar14;
  local_178 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_174 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_170 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_16c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = iVar217 + uVar146;
  iVar61 = iVar104 + uVar151;
  iVar212 = iVar106 + uVar156;
  iVar67 = iVar107 + uVar220;
  iVar217 = uVar146 - iVar217;
  iVar104 = uVar151 - iVar104;
  iVar106 = uVar156 - iVar106;
  iVar107 = uVar220 - iVar107;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar150 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar155 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  local_1f8 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_1f4 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_1f0 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_1ec = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar217 < local_248) * local_248 | (uint)(iVar217 >= local_248) * iVar217;
  uVar145 = (uint)(iVar104 < local_248) * local_248 | (uint)(iVar104 >= local_248) * iVar104;
  uVar150 = (uint)(iVar106 < local_248) * local_248 | (uint)(iVar106 >= local_248) * iVar106;
  uVar155 = (uint)(iVar107 < local_248) * local_248 | (uint)(iVar107 >= local_248) * iVar107;
  local_188 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_184 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_180 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_17c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = iVar55 + uVar237;
  iVar61 = iVar45 + uVar245;
  iVar212 = iVar163 + uVar249;
  iVar67 = iVar13 + uVar253;
  iVar55 = uVar237 - iVar55;
  iVar45 = uVar245 - iVar45;
  iVar163 = uVar249 - iVar163;
  iVar13 = uVar253 - iVar13;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar150 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar155 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  local_1e8 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_1e4 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_1e0 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_1dc = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  uVar145 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar150 = (uint)(iVar163 < local_248) * local_248 | (uint)(iVar163 >= local_248) * iVar163;
  uVar155 = (uint)(iVar13 < local_248) * local_248 | (uint)(iVar13 >= local_248) * iVar13;
  local_198 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_194 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_190 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_18c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = uVar92 + uVar113;
  iVar55 = uVar34 + uVar121;
  iVar61 = uVar57 + uVar126;
  iVar212 = uVar71 + uVar132;
  iVar67 = uVar92 - uVar113;
  iVar45 = uVar34 - uVar121;
  iVar134 = uVar57 - uVar126;
  iVar18 = uVar71 - uVar132;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  uVar150 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar155 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  local_1d8 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_1d4 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_1d0 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_1cc = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  uVar135 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar145 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar150 = (uint)(iVar134 < local_248) * local_248 | (uint)(iVar134 >= local_248) * iVar134;
  uVar155 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  local_1a8 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_1a4 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_1a0 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_19c = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  iVar46 = uVar98 + uVar75;
  iVar55 = uVar131 + uVar88;
  iVar61 = uVar48 + uVar95;
  iVar212 = uVar69 + uVar103;
  iVar67 = uVar98 - uVar75;
  iVar45 = uVar131 - uVar88;
  iVar134 = uVar48 - uVar95;
  iVar18 = uVar69 - uVar103;
  uVar135 = (uint)(iVar46 < local_248) * local_248 | (uint)(iVar46 >= local_248) * iVar46;
  uVar145 = (uint)(iVar55 < local_248) * local_248 | (uint)(iVar55 >= local_248) * iVar55;
  uVar150 = (uint)(iVar61 < local_248) * local_248 | (uint)(iVar61 >= local_248) * iVar61;
  uVar155 = (uint)(iVar212 < local_248) * local_248 | (uint)(iVar212 >= local_248) * iVar212;
  uVar98 = (uint)(iVar67 < local_248) * local_248 | (uint)(iVar67 >= local_248) * iVar67;
  uVar92 = (uint)(iVar45 < local_248) * local_248 | (uint)(iVar45 >= local_248) * iVar45;
  uVar29 = (uint)(iVar134 < local_248) * local_248 | (uint)(iVar134 >= local_248) * iVar134;
  uVar131 = (uint)(iVar18 < local_248) * local_248 | (uint)(iVar18 >= local_248) * iVar18;
  local_1c8 = (uint)(local_258 < (int)uVar135) * local_258 | (local_258 >= (int)uVar135) * uVar135;
  uStack_1c4 = (uint)(local_258 < (int)uVar145) * local_258 | (local_258 >= (int)uVar145) * uVar145;
  uStack_1c0 = (uint)(local_258 < (int)uVar150) * local_258 | (local_258 >= (int)uVar150) * uVar150;
  uStack_1bc = (uint)(local_258 < (int)uVar155) * local_258 | (local_258 >= (int)uVar155) * uVar155;
  local_1b8 = (uint)(local_258 < (int)uVar98) * local_258 | (local_258 >= (int)uVar98) * uVar98;
  uStack_1b4 = (uint)(local_258 < (int)uVar92) * local_258 | (local_258 >= (int)uVar92) * uVar92;
  uStack_1b0 = (uint)(local_258 < (int)uVar29) * local_258 | (local_258 >= (int)uVar29) * uVar29;
  uStack_1ac = (uint)(local_258 < (int)uVar131) * local_258 | (local_258 >= (int)uVar131) * uVar131;
  auVar81._0_4_ = auVar80._0_4_ + auVar51._0_4_;
  auVar81._4_4_ = auVar80._4_4_ + auVar51._4_4_;
  auVar81._8_4_ = auVar80._8_4_ + auVar51._8_4_;
  auVar81._12_4_ = auVar80._12_4_ + auVar51._12_4_;
  auVar188 = pmulld(auVar51,auVar24);
  auVar176 = pmulld(auVar80,auVar22);
  auVar50 = pmulld(auVar81,auVar22);
  iStack_84 = auVar50._4_4_ + iVar12 >> auVar105;
  local_88 = auVar50._0_4_ + iVar12 >> auVar105;
  iStack_80 = auVar50._8_4_ + iVar12 >> auVar105;
  iStack_7c = auVar50._12_4_ + iVar12 >> auVar105;
  iStack_f4 = auVar176._4_4_ + iVar12 + auVar188._4_4_ >> auVar105;
  local_f8 = auVar176._0_4_ + iVar12 + auVar188._0_4_ >> auVar105;
  iStack_f0 = auVar176._8_4_ + iVar12 + auVar188._8_4_ >> auVar105;
  iStack_ec = auVar176._12_4_ + iVar12 + auVar188._12_4_ >> auVar105;
  auVar214._0_4_ = auVar213._0_4_ + local_418._0_4_;
  auVar214._4_4_ = auVar213._4_4_ + local_418._4_4_;
  auVar214._8_4_ = auVar213._8_4_ + local_418._8_4_;
  auVar214._12_4_ = auVar213._12_4_ + local_418._12_4_;
  auVar188 = pmulld(local_418,auVar24);
  auVar176 = pmulld(auVar213,auVar22);
  auVar50 = pmulld(auVar214,auVar22);
  iStack_94 = auVar50._4_4_ + iVar12 >> auVar105;
  local_98 = auVar50._0_4_ + iVar12 >> auVar105;
  iStack_90 = auVar50._8_4_ + iVar12 >> auVar105;
  iStack_8c = auVar50._12_4_ + iVar12 >> auVar105;
  local_e8 = auVar188._0_4_ + iVar12 + auVar176._0_4_ >> auVar105;
  iStack_e4 = auVar188._4_4_ + iVar12 + auVar176._4_4_ >> auVar105;
  iStack_e0 = auVar188._8_4_ + iVar12 + auVar176._8_4_ >> auVar105;
  iStack_dc = auVar188._12_4_ + iVar12 + auVar176._12_4_ >> auVar105;
  auVar82._0_4_ = local_3a8._0_4_ + local_398._0_4_;
  auVar82._4_4_ = local_3a8._4_4_ + local_398._4_4_;
  auVar82._8_4_ = local_3a8._8_4_ + local_398._8_4_;
  auVar82._12_4_ = local_3a8._12_4_ + local_398._12_4_;
  auVar188 = pmulld(local_398,auVar24);
  auVar176 = pmulld(local_3a8,auVar22);
  local_d8 = auVar188._0_4_ + iVar12 + auVar176._0_4_ >> auVar105;
  iStack_d4 = auVar188._4_4_ + iVar12 + auVar176._4_4_ >> auVar105;
  iStack_d0 = auVar188._8_4_ + iVar12 + auVar176._8_4_ >> auVar105;
  iStack_cc = auVar188._12_4_ + iVar12 + auVar176._12_4_ >> auVar105;
  auVar176 = pmulld(auVar82,auVar22);
  local_a8 = auVar176._0_4_ + iVar12 >> auVar105;
  iStack_a4 = auVar176._4_4_ + iVar12 >> auVar105;
  iStack_a0 = auVar176._8_4_ + iVar12 >> auVar105;
  iStack_9c = auVar176._12_4_ + iVar12 >> auVar105;
  auVar76._4_4_ = uVar100;
  auVar76._0_4_ = uVar26;
  auVar76._8_4_ = uVar35;
  auVar76._12_4_ = uVar28;
  auVar50 = pmulld(auVar24,auVar76);
  auVar176 = pmulld(local_428,auVar22);
  auVar44._0_4_ = local_428._0_4_ + uVar26;
  auVar44._4_4_ = local_428._4_4_ + uVar100;
  auVar44._8_4_ = local_428._8_4_ + uVar35;
  auVar44._12_4_ = local_428._12_4_ + uVar28;
  auVar188 = pmulld(auVar44,auVar22);
  local_c8 = auVar176._0_4_ + iVar12 + auVar50._0_4_ >> auVar105;
  iStack_c4 = auVar176._4_4_ + iVar12 + auVar50._4_4_ >> auVar105;
  iStack_c0 = auVar176._8_4_ + iVar12 + auVar50._8_4_ >> auVar105;
  iStack_bc = auVar176._12_4_ + iVar12 + auVar50._12_4_ >> auVar105;
  local_b8 = auVar188._0_4_ + iVar12 >> auVar105;
  iStack_b4 = auVar188._4_4_ + iVar12 >> auVar105;
  iStack_b0 = auVar188._8_4_ + iVar12 >> auVar105;
  iStack_ac = auVar188._12_4_ + iVar12 >> auVar105;
  iStack_254 = local_258;
  iStack_250 = local_258;
  iStack_24c = local_258;
  iStack_244 = local_248;
  iStack_240 = local_248;
  iStack_23c = local_248;
  idct32_stage9_sse4_1
            ((__m128i *)&local_238,out,do_cols,bd,out_shift,(__m128i *)&local_248,
             (__m128i *)&local_258);
  return;
}

Assistant:

static void idct32x32_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i rounding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i bf1[32];

  // stage 0
  // stage 1
  bf1[0] = in[0];
  bf1[4] = in[4];
  bf1[8] = in[2];
  bf1[12] = in[6];
  bf1[16] = in[1];
  bf1[20] = in[5];
  bf1[24] = in[3];
  bf1[28] = in[7];

  // stage 2
  bf1[31] = half_btf_0_sse4_1(&cospi2, &bf1[16], &rounding, bit);
  bf1[16] = half_btf_0_sse4_1(&cospi62, &bf1[16], &rounding, bit);
  bf1[19] = half_btf_0_sse4_1(&cospim50, &bf1[28], &rounding, bit);
  bf1[28] = half_btf_0_sse4_1(&cospi14, &bf1[28], &rounding, bit);
  bf1[27] = half_btf_0_sse4_1(&cospi10, &bf1[20], &rounding, bit);
  bf1[20] = half_btf_0_sse4_1(&cospi54, &bf1[20], &rounding, bit);
  bf1[23] = half_btf_0_sse4_1(&cospim58, &bf1[24], &rounding, bit);
  bf1[24] = half_btf_0_sse4_1(&cospi6, &bf1[24], &rounding, bit);

  // stage 3
  bf1[15] = half_btf_0_sse4_1(&cospi4, &bf1[8], &rounding, bit);
  bf1[8] = half_btf_0_sse4_1(&cospi60, &bf1[8], &rounding, bit);

  bf1[11] = half_btf_0_sse4_1(&cospim52, &bf1[12], &rounding, bit);
  bf1[12] = half_btf_0_sse4_1(&cospi12, &bf1[12], &rounding, bit);
  bf1[17] = bf1[16];
  bf1[18] = bf1[19];
  bf1[21] = bf1[20];
  bf1[22] = bf1[23];
  bf1[25] = bf1[24];
  bf1[26] = bf1[27];
  bf1[29] = bf1[28];
  bf1[30] = bf1[31];

  // stage 4 :
  bf1[7] = half_btf_0_sse4_1(&cospi8, &bf1[4], &rounding, bit);
  bf1[4] = half_btf_0_sse4_1(&cospi56, &bf1[4], &rounding, bit);

  bf1[9] = bf1[8];
  bf1[10] = bf1[11];
  bf1[13] = bf1[12];
  bf1[14] = bf1[15];

  idct32_stage4_sse4_1(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

  // stage 5
  bf1[0] = half_btf_0_sse4_1(&cospi32, &bf1[0], &rounding, bit);
  bf1[1] = bf1[0];
  bf1[5] = bf1[4];
  bf1[6] = bf1[7];

  idct32_stage5_sse4_1(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

  // stage 6
  bf1[3] = bf1[0];
  bf1[2] = bf1[1];

  idct32_stage6_sse4_1(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

  // stage 7
  idct32_stage7_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

  // stage 8
  idct32_stage8_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

  // stage 9
  idct32_stage9_sse4_1(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
}